

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,EVP_PKEY_CTX *ctx)

{
  std::ranges::__destroy_fn::operator()<slang::SmallVectorBase<slang::ast::EvalContext::Frame>_&>
            ((__destroy_fn *)&std::ranges::destroy,this);
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }